

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevutil.cpp
# Opt level: O2

ParsedSpecification *
QEvdevUtil::parseSpecification(ParsedSpecification *__return_storage_ptr__,QString *specification)

{
  bool bVar1;
  long lVar2;
  QStringView *arg;
  QStringView *this;
  long in_FS_OFFSET;
  QLatin1StringView s;
  qsizetype local_60;
  char16_t *local_58;
  QArrayDataPointer<QStringView> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->args).d.d = (Data *)0x0;
  (__return_storage_ptr__->args).d.ptr = (QStringView *)0x0;
  (__return_storage_ptr__->devices).d.ptr = (QString *)0x0;
  (__return_storage_ptr__->devices).d.size = 0;
  (__return_storage_ptr__->args).d.size = 0;
  (__return_storage_ptr__->spec).d.size = 0;
  (__return_storage_ptr__->devices).d.d = (Data *)0x0;
  (__return_storage_ptr__->spec).d.d = (Data *)0x0;
  (__return_storage_ptr__->spec).d.ptr = (char16_t *)0x0;
  local_58 = (specification->d).ptr;
  local_60 = (specification->d).size;
  QStringView::split(&local_50,&local_60,0x3a,0,1);
  QArrayDataPointer<QStringView>::operator=(&(__return_storage_ptr__->args).d,&local_50);
  QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_50);
  this = (__return_storage_ptr__->args).d.ptr;
  for (lVar2 = (__return_storage_ptr__->args).d.size << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    s.m_data = "/dev/";
    s.m_size = 5;
    bVar1 = QStringView::startsWith(this,s,CaseSensitive);
    if (bVar1) {
      QStringView::toString((QString *)&local_50,this);
      QList<QString>::emplaceBack<QString>(&__return_storage_ptr__->devices,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
    }
    else {
      local_50.ptr._0_2_ = 0x3a;
      local_50.d = (Data *)this;
      operator+=(&__return_storage_ptr__->spec,
                 (QStringBuilder<const_QStringView_&,_char16_t> *)&local_50);
    }
    this = this + 1;
  }
  if ((__return_storage_ptr__->spec).d.size != 0) {
    QString::chop((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ParsedSpecification parseSpecification(const QString &specification)
{
    ParsedSpecification result;

    result.args = QStringView{specification}.split(u':');

    for (const auto &arg : std::as_const(result.args)) {
        if (arg.startsWith("/dev/"_L1)) {
            // if device is specified try to use it
            result.devices.append(arg.toString());
#ifdef Q_OS_VXWORKS
        } else if (arg.startsWith("/input/"_L1)) {
            result.devices.append(arg.toString());
#endif
        } else {
            // build new specification without /dev/ elements
            result.spec += arg + u':';
        }
    }

    if (!result.spec.isEmpty())
        result.spec.chop(1); // remove trailing ':'

    return result;
}